

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O0

int SensorBase::detect_sensor(string *type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__rhs;
  bool bVar1;
  __type _Var2;
  path *ppVar3;
  value_type *path;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  ulong local_1c0;
  size_t i;
  undefined1 local_190 [8];
  string es;
  string local_150;
  path local_130;
  undefined1 local_108 [8];
  path name_path;
  directory_entry *ent;
  directory_iterator local_d0;
  undefined1 local_c0 [8];
  directory_iterator __end1;
  undefined1 local_a0 [8];
  directory_iterator __begin1;
  directory_iterator *__range1;
  path local_68;
  undefined1 local_40 [8];
  path sysfsbasepath;
  string *type_local;
  
  sysfsbasepath._32_8_ = type;
  std::filesystem::__cxx11::path::path<char[32],std::filesystem::__cxx11::path>
            (&local_68,(char (*) [32])"/sys/bus/iio/devices/iio:device",auto_format);
  ppVar3 = (path *)std::filesystem::__cxx11::path::remove_filename();
  std::filesystem::__cxx11::path::path((path *)local_40,ppVar3);
  std::filesystem::__cxx11::path::~path(&local_68);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__begin1._M_dir._M_refcount,(path *)local_40);
  __rhs = &__begin1._M_dir._M_refcount;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount,(directory_iterator *)__rhs);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_a0,(directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_d0,(directory_iterator *)__rhs);
  std::filesystem::__cxx11::end((directory_iterator *)local_c0);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_d0);
  while (bVar1 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_a0,(directory_iterator *)local_c0), bVar1) {
    name_path._32_8_ =
         std::filesystem::__cxx11::directory_iterator::operator*((directory_iterator *)local_a0);
    ppVar3 = std::filesystem::__cxx11::directory_entry::path((directory_entry *)name_path._32_8_);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_130,(char (*) [5])"name",auto_format);
    std::filesystem::__cxx11::operator/((path *)local_108,ppVar3,&local_130);
    std::filesystem::__cxx11::path::~path(&local_130);
    path = std::filesystem::__cxx11::path::c_str((path *)local_108);
    readstr_abi_cxx11_((string *)((long)&es.field_2 + 8),path,0x100);
    trim(&local_150,(string *)((long)&es.field_2 + 8));
    _Var2 = std::operator==(&local_150,type);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)(es.field_2._M_local_buf + 8));
    if (_Var2) {
      ppVar3 = std::filesystem::__cxx11::directory_entry::path((directory_entry *)name_path._32_8_);
      std::filesystem::__cxx11::path::filename((path *)&i,ppVar3);
      std::filesystem::__cxx11::path::string((string *)local_190,(path *)&i);
      std::filesystem::__cxx11::path::~path((path *)&i);
      local_1c0 = 0;
      while( true ) {
        uVar4 = std::__cxx11::string::length();
        bVar1 = false;
        if (local_1c0 < uVar4) {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_190);
          bVar1 = true;
          if ('/' < *pcVar5) {
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_190);
            bVar1 = '9' < *pcVar5;
          }
        }
        if (!bVar1) break;
        local_1c0 = local_1c0 + 1;
      }
      uVar4 = std::__cxx11::string::length();
      if (local_1c0 < uVar4) {
        lVar6 = std::__cxx11::string::c_str();
        type_local._4_4_ = atoi((char *)(lVar6 + local_1c0));
      }
      else {
        type_local._4_4_ = -1;
      }
      ent._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_190);
    }
    else {
      ent._4_4_ = 0;
    }
    std::filesystem::__cxx11::path::~path((path *)local_108);
    if (ent._4_4_ != 0) goto LAB_00128e0d;
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_a0);
  }
  ent._4_4_ = 2;
LAB_00128e0d:
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_c0);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_a0);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__begin1._M_dir._M_refcount);
  if (ent._4_4_ == 2) {
    type_local._4_4_ = -1;
  }
  std::filesystem::__cxx11::path::~path((path *)local_40);
  return type_local._4_4_;
}

Assistant:

int SensorBase::detect_sensor(std::string type)
{
	using filesystem::path;
	path sysfsbasepath=path(IIODEV_SYSFS_PATH_BASE).remove_filename();
	for(auto& ent:filesystem::directory_iterator(sysfsbasepath))
	{
		path name_path=ent.path()/"name";
		if(trim(readstr(name_path.c_str()))==type)
		{
			std::string es=ent.path().filename().string();
			size_t i;
			for(i=0;i<es.length()&&(es[i]<'0'||es[i]>'9');++i);
			if(i<es.length())return atoi(es.c_str()+i);
			return -1;
		}
	}
	return -1;
}